

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *
google::protobuf::internal::MapKeySorter::SortKey
          (vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
           *__return_storage_ptr__,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  pointer *ppMVar1;
  iterator __position;
  pointer pMVar2;
  pointer pMVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  MapIterator it;
  MapIterator local_c0;
  MapIterator local_78;
  
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::MapBegin(&local_c0,reflection,message,field);
  while( true ) {
    Reflection::MapEnd(&local_78,reflection,message,field);
    bVar5 = MapFieldBase::EqualIterator(local_c0.map_,&local_c0,&local_78);
    if (bVar5) break;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>::
      _M_realloc_insert<google::protobuf::MapKey_const&>
                ((vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>> *)
                 __return_storage_ptr__,__position,&local_c0.key_);
    }
    else {
      (__position._M_current)->type_ = local_c0.key_.type_;
      *(undefined4 *)&(__position._M_current)->field_0x14 = local_c0.key_._20_4_;
      ((__position._M_current)->val_).string_value._M_len = local_c0.key_.val_.string_value._M_len;
      ((__position._M_current)->val_).string_value._M_str = local_c0.key_.val_.string_value._M_str;
      ppMVar1 = &(__return_storage_ptr__->
                 super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    MapFieldBase::IncreaseIterator(local_c0.map_,&local_c0);
  }
  pMVar2 = (__return_storage_ptr__->
           super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (__return_storage_ptr__->
           super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pMVar2 != pMVar3) {
    uVar6 = ((long)pMVar3 - (long)pMVar2 >> 3) * -0x5555555555555555;
    lVar4 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapKeySorter::MapKeyComparator>>
              (pMVar2,pMVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::MapKey*,std::vector<google::protobuf::MapKey,std::allocator<google::protobuf::MapKey>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::internal::MapKeySorter::MapKeyComparator>>
              (pMVar2,pMVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<MapKey> SortKey(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field) {
    std::vector<MapKey> sorted_key_list;
    for (MapIterator it =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         it != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++it) {
      sorted_key_list.push_back(it.GetKey());
    }
    MapKeyComparator comparator;
    std::sort(sorted_key_list.begin(), sorted_key_list.end(), comparator);
    return sorted_key_list;
  }